

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id;
  __node_base *p_Var5;
  pointer pbVar6;
  string orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string dirs;
  ostringstream w;
  
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0019);
  if (PVar2 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    std::__cxx11::string::string((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator *)&orig);
    pcVar3 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    bVar1 = mightExpandVariablesCMP0019(pcVar3);
    if (bVar1) {
      std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&orig);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if (PVar2 == WARN) {
        bVar1 = std::operator!=(&dirs,pcVar3);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n");
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = std::operator<<(poVar4,pcVar3);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"as\n");
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = std::operator<<(poVar4,(string *)&dirs);
          std::operator<<(poVar4,"\n");
        }
      }
      std::__cxx11::string::string((string *)&orig,"INCLUDE_DIRECTORIES",(allocator *)&linkLibs);
      SetProperty(this,&orig,dirs._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&orig);
      std::__cxx11::string::~string((string *)&dirs);
    }
    p_Var5 = &(this->Targets)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      if (((ulong)p_Var5[0x47]._M_nxt & 0xfffffffe) != 6) {
        std::__cxx11::string::string((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator *)&orig);
        pcVar3 = cmTarget::GetProperty((cmTarget *)(p_Var5 + 5),&dirs);
        std::__cxx11::string::~string((string *)&dirs);
        bVar1 = mightExpandVariablesCMP0019(pcVar3);
        if (bVar1) {
          std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&orig);
          ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
          if (PVar2 == WARN) {
            bVar1 = std::operator!=(&dirs,pcVar3);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&w,"Evaluated target ");
              poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 0x27));
              poVar4 = std::operator<<(poVar4," INCLUDE_DIRECTORIES\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,pcVar3);
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"as\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&dirs);
              std::operator<<(poVar4,"\n");
            }
          }
          std::__cxx11::string::string((string *)&orig,"INCLUDE_DIRECTORIES",(allocator *)&linkLibs)
          ;
          cmTarget::SetProperty((cmTarget *)(p_Var5 + 5),&orig,dirs._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&orig);
          std::__cxx11::string::~string((string *)&dirs);
        }
      }
    }
    std::__cxx11::string::string((string *)&dirs,"LINK_DIRECTORIES",(allocator *)&orig);
    pcVar3 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (pcVar3 != (char *)0x0) {
      bVar1 = mightExpandVariablesCMP0019(pcVar3);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&orig);
        std::__cxx11::string::string((string *)&orig,pcVar3,(allocator *)&linkLibs);
        ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
        if (PVar2 == WARN) {
          bVar1 = std::operator!=(&dirs,&orig);
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&w,"Evaluated link directories\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)&orig);
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"as\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)&dirs);
            std::operator<<(poVar4,"\n");
          }
        }
        std::__cxx11::string::~string((string *)&orig);
        std::__cxx11::string::~string((string *)&dirs);
      }
    }
    std::__cxx11::string::string((string *)&dirs,"LINK_LIBRARIES",(allocator *)&orig);
    pcVar3 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (pcVar3 != (char *)0x0) {
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&orig);
      cmSystemTools::ExpandListArgument(&dirs,&linkLibs,false);
      std::__cxx11::string::~string((string *)&dirs);
      for (pbVar6 = linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        std::__cxx11::string::string((string *)&dirs,(string *)pbVar6);
        bVar1 = std::operator==(&dirs,"optimized");
        if (bVar1) {
          pbVar6 = pbVar6 + 1;
          std::__cxx11::string::_M_assign((string *)&dirs);
        }
        else {
          bVar1 = std::operator==(&dirs,"debug");
          if (bVar1) {
            pbVar6 = pbVar6 + 1;
            std::__cxx11::string::_M_assign((string *)&dirs);
          }
        }
        bVar1 = mightExpandVariablesCMP0019(dirs._M_dataplus._M_p);
        if (bVar1) {
          std::__cxx11::string::string((string *)&orig,(string *)&dirs);
          ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
          if (PVar2 == WARN) {
            bVar1 = std::operator!=(&dirs,&orig);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&w,"Evaluated link library\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&orig);
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"as\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&dirs);
              std::operator<<(poVar4,"\n");
            }
          }
          std::__cxx11::string::~string((string *)&orig);
        }
        std::__cxx11::string::~string((string *)&dirs);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&dirs);
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&orig,(cmPolicies *)0x13,id);
      poVar4 = std::operator<<((ostream *)&dirs,(string *)&orig);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"The following variable evaluations were encountered:\n");
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar4,(string *)&linkLibs);
      std::__cxx11::string::~string((string *)&linkLibs);
      std::__cxx11::string::~string((string *)&orig);
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&orig,&this->Backtrace);
      std::__cxx11::string::~string((string *)&orig);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  const char* includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (mightExpandVariablesCMP0019(includeDirs)) {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin(); l != this->Targets.end();
       ++l) {
    cmTarget& t = l->second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (mightExpandVariablesCMP0019(includeDirs)) {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }
  }

  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp)) {
      std::string d = linkDirsProp;
      std::string orig = linkDirsProp;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator l = linkLibs.begin();
         l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized") {
        ++l;
        libName = *l;
      } else if (libName == "debug") {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, m.str(),
                                           this->Backtrace);
  }
}